

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::Option::each(Option *this,
                 function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *func)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_38;
  
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_38,func);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  ::std::vector<CLI::Validator,std::allocator<CLI::Validator>>::
  emplace_back<CLI::Option::each(std::function<void(std::__cxx11::string)>const&)::_lambda(std::__cxx11::string&)_1_,std::__cxx11::string>
            ((vector<CLI::Validator,std::allocator<CLI::Validator>> *)&this->validators_,
             (anon_class_32_1_898bcfc2 *)&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return this;
}

Assistant:

CLI11_INLINE Option *Option::each(const std::function<void(std::string)> &func) {
    validators_.emplace_back(
        [func](std::string &inout) {
            func(inout);
            return std::string{};
        },
        std::string{});
    return this;
}